

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

void __thiscall QFileInfo::QFileInfo(QFileInfo *this,QFileDevice *file)

{
  QFileInfoPrivate *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QFileInfoPrivate *)operator_new(0x1e8);
  (*(file->super_QIODevice).super_QObject._vptr_QObject[0x1d])(&local_38,file);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  QFileSystemEntry::QFileSystemEntry(&pQVar1->fileEntry,&local_38);
  (pQVar1->metaData).knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0
  ;
  (pQVar1->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (pQVar1->metaData).size_ = -1;
  (pQVar1->metaData).accessTime_ = 0;
  (pQVar1->metaData).birthTime_ = 0;
  (pQVar1->metaData).metadataChangeTime_ = 0;
  (pQVar1->metaData).modificationTime_ = 0;
  (pQVar1->metaData).userId_ = 0xfffffffe;
  (pQVar1->metaData).groupId_ = 0xfffffffe;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEngine *)&pQVar1->fileEngine,&pQVar1->fileEntry,&pQVar1->metaData);
  memset(pQVar1->fileNames,0,0x138);
  lVar2 = 0x1b8;
  do {
    QDateTime::QDateTime((QDateTime *)((long)pQVar1->fileNames + lVar2 + -0x80));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x1d8);
  *(uint *)&pQVar1->field_0x1d8 = (local_38.d.size == 0 | 0xfffffffe) << 0x1e;
  pQVar1->fileFlags = 0;
  pQVar1->fileSize = 0;
  (this->d_ptr).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo::QFileInfo(const QFileDevice &file) : d_ptr(new QFileInfoPrivate(file.fileName()))
{
}